

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Server.cc
# Opt level: O0

void __thiscall tt::net::Server::Server(Server *this,EventLoop *loop,int threadNum,int port)

{
  int iVar1;
  EventLoopThreadPool *this_00;
  Channel *this_01;
  element_type *this_02;
  int port_local;
  int threadNum_local;
  EventLoop *loop_local;
  Server *this_local;
  
  this->loop_ = loop;
  this->threadNum_ = threadNum;
  this_00 = (EventLoopThreadPool *)operator_new(0x48);
  EventLoopThreadPool::EventLoopThreadPool(this_00,this->loop_,threadNum);
  std::unique_ptr<tt::net::EventLoopThreadPool,std::default_delete<tt::net::EventLoopThreadPool>>::
  unique_ptr<std::default_delete<tt::net::EventLoopThreadPool>,void>
            ((unique_ptr<tt::net::EventLoopThreadPool,std::default_delete<tt::net::EventLoopThreadPool>>
              *)&this->eventLoopThreadPool_,this_00);
  this->started_ = false;
  this_01 = (Channel *)operator_new(0xa8);
  Channel::Channel(this_01,this->loop_);
  std::shared_ptr<tt::net::Channel>::shared_ptr<tt::net::Channel,void>
            (&this->acceptChannel_,this_01);
  this->port_ = port;
  iVar1 = socket_bind_listen(this->port_);
  this->listenFd_ = iVar1;
  this_02 = std::__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<tt::net::Channel,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->acceptChannel_);
  Channel::setFd(this_02,this->listenFd_);
  handle_for_sigpipe();
  iVar1 = setSocketNonBlocking(this->listenFd_);
  if (iVar1 < 0) {
    perror("set socket non block failed");
    abort();
  }
  return;
}

Assistant:

Server::Server(EventLoop *loop, int threadNum, int port)
    : loop_(loop),
      threadNum_(threadNum),
      eventLoopThreadPool_(new EventLoopThreadPool(loop_, threadNum)),
      started_(false),
      acceptChannel_(new Channel(loop_)),
      port_(port),
      listenFd_(socket_bind_listen(port_)) {
  acceptChannel_->setFd(listenFd_);
  handle_for_sigpipe();
  if(setSocketNonBlocking(listenFd_) < 0) {
//	  std::cout << "listenFd = " << listenFd_ << std::endl;
    perror("set socket non block failed");
    abort();
  }
}